

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelCreationUtils.cpp
# Opt level: O2

NeuralNetwork *
addInnerProductLayer
          (Model *m,bool isUpdatable,char *name,TensorAttributes *inTensorAttr,
          TensorAttributes *outTensorAttr,bool areWeightsQuantized,bool isBiasQuantized)

{
  ulong uVar1;
  NeuralNetwork *pNVar2;
  NeuralNetworkLayer *this;
  InnerProductLayerParams *this_00;
  WeightParams *pWVar3;
  QuantizationParams *pQVar4;
  LinearQuantizationParams *pLVar5;
  undefined8 *puVar6;
  
  pNVar2 = CoreML::Specification::Model::_internal_mutable_neuralnetwork(m);
  this = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                   (&pNVar2->layers_);
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  puVar6 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar6 = (undefined8 *)*puVar6;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&this->name_,name,puVar6);
  CoreML::Specification::NeuralNetworkLayer::add_input(this,inTensorAttr->name);
  CoreML::Specification::NeuralNetworkLayer::add_output(this,outTensorAttr->name);
  this_00 = CoreML::Specification::NeuralNetworkLayer::_internal_mutable_innerproduct(this);
  this_00->inputchannels_ = 1;
  this_00->outputchannels_ = 1;
  pWVar3 = CoreML::Specification::InnerProductLayerParams::_internal_mutable_weights(this_00);
  if (areWeightsQuantized) {
    pQVar4 = CoreML::Specification::WeightParams::_internal_mutable_quantization(pWVar3);
    pQVar4->numberofbits_ = 1;
    pLVar5 = CoreML::Specification::QuantizationParams::_internal_mutable_linearquantization(pQVar4)
    ;
    CoreML::Specification::LinearQuantizationParams::_internal_add_scale(pLVar5,1.0);
    CoreML::Specification::LinearQuantizationParams::_internal_add_bias(pLVar5,0.0);
    uVar1 = (pWVar3->super_MessageLite)._internal_metadata_.ptr_;
    puVar6 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar6 = (undefined8 *)*puVar6;
    }
    google::protobuf::internal::ArenaStringPtr::
    Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
              (&pWVar3->int8rawvalue_,"x01",puVar6);
  }
  else {
    CoreML::Specification::WeightParams::_internal_add_floatvalue(pWVar3,1.0);
  }
  this_00->hasbias_ = true;
  pWVar3 = CoreML::Specification::InnerProductLayerParams::_internal_mutable_bias(this_00);
  if (isBiasQuantized) {
    pQVar4 = CoreML::Specification::WeightParams::_internal_mutable_quantization(pWVar3);
    pQVar4->numberofbits_ = 1;
    pLVar5 = CoreML::Specification::QuantizationParams::_internal_mutable_linearquantization(pQVar4)
    ;
    CoreML::Specification::LinearQuantizationParams::_internal_add_scale(pLVar5,1.0);
    CoreML::Specification::LinearQuantizationParams::_internal_add_bias(pLVar5,0.0);
    uVar1 = (pWVar3->super_MessageLite)._internal_metadata_.ptr_;
    puVar6 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar6 = (undefined8 *)*puVar6;
    }
    google::protobuf::internal::ArenaStringPtr::
    Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
              (&pWVar3->int8rawvalue_,"x01",puVar6);
  }
  else {
    CoreML::Specification::WeightParams::_internal_add_floatvalue(pWVar3,1.0);
  }
  if (isUpdatable) {
    this->isupdatable_ = true;
    pWVar3 = CoreML::Specification::InnerProductLayerParams::_internal_mutable_weights(this_00);
    pWVar3->isupdatable_ = true;
    pWVar3 = CoreML::Specification::InnerProductLayerParams::_internal_mutable_bias(this_00);
    pWVar3->isupdatable_ = true;
  }
  return pNVar2;
}

Assistant:

Specification::NeuralNetwork* addInnerProductLayer(Specification::Model& m, bool isUpdatable, const char *name, const TensorAttributes *inTensorAttr, const TensorAttributes *outTensorAttr, bool areWeightsQuantized, bool isBiasQuantized) {
    
    auto neuralNet = m.mutable_neuralnetwork();
    auto layer = neuralNet->add_layers();
    
    layer->set_name(name);
    layer->add_input(inTensorAttr->name);
    layer->add_output(outTensorAttr->name);
    Specification::InnerProductLayerParams *innerProductParams = layer->mutable_innerproduct();
    innerProductParams->set_inputchannels(1);
    innerProductParams->set_outputchannels(1);

    // set weight
    auto* weights = innerProductParams->mutable_weights();
    if (areWeightsQuantized) {
        auto *quant_params = weights->mutable_quantization();
        quant_params->set_numberofbits(1);
        auto *linear_quant_params = quant_params->mutable_linearquantization();
        linear_quant_params->add_scale(1.0f);
        linear_quant_params->add_bias(0.0f);
        weights->set_int8rawvalue("x01"); // this is [1]
    } else {
        weights->add_floatvalue(1.0);
    }

    // set bias
    innerProductParams->set_hasbias(true);
    auto* bias = innerProductParams->mutable_bias();
    if (isBiasQuantized) {
        auto *quant_params = bias->mutable_quantization();
        quant_params->set_numberofbits(1);
        auto *linear_quant_params = quant_params->mutable_linearquantization();
        linear_quant_params->add_scale(1.0f);
        linear_quant_params->add_bias(0.0f);
        bias->set_int8rawvalue("x01"); // this is [1]
    } else {
        bias->add_floatvalue(1.0);
    }
    
    if (isUpdatable) {
        layer->set_isupdatable(true);
        innerProductParams->mutable_weights()->set_isupdatable(true);
        innerProductParams->mutable_bias()->set_isupdatable(true);
    }

    return neuralNet;
}